

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void restartcollection(global_State *g)

{
  global_State *g_local;
  
  cleargraylists(g);
  if ((g->mainthread->marked & 0x18) != 0) {
    if (9 < (g->mainthread->tt & 0xf)) {
      __assert_fail("(((g->mainthread)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x1ea,"void restartcollection(global_State *)");
    }
    reallymarkobject(g,(GCObject *)g->mainthread);
  }
  if (((g->l_registry).tt_ & 0x8000) != 0) {
    if (((g->l_registry).tt_ & 0x8000) == 0) {
      __assert_fail("(((&g->l_registry)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x1eb,"void restartcollection(global_State *)");
    }
    if (((g->l_registry).tt_ & 0x7f) != (ushort)((g->l_registry).value_.gc)->tt) {
LAB_00128b06:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x1eb,"void restartcollection(global_State *)");
    }
    if (g->mainthread != (lua_State *)0x0) {
      if (((g->l_registry).tt_ & 0x8000) == 0) {
        __assert_fail("(((&g->l_registry)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x1eb,"void restartcollection(global_State *)");
      }
      if ((((g->l_registry).value_.gc)->marked & (g->mainthread->l_G->currentwhite ^ 0x18)) != 0)
      goto LAB_00128b06;
    }
  }
  if (((g->l_registry).tt_ & 0x8000) != 0) {
    if (((g->l_registry).tt_ & 0x8000) == 0) {
      __assert_fail("(((&g->l_registry)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x1eb,"void restartcollection(global_State *)");
    }
    if ((((g->l_registry).value_.gc)->marked & 0x18) != 0) {
      if (((g->l_registry).tt_ & 0x8000) == 0) {
        __assert_fail("(((&g->l_registry)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x1eb,"void restartcollection(global_State *)");
      }
      reallymarkobject(g,(g->l_registry).value_.gc);
    }
  }
  markmt(g);
  markbeingfnz(g);
  return;
}

Assistant:

static void restartcollection (global_State *g) {
  cleargraylists(g);
  markobject(g, g->mainthread);
  markvalue(g, &g->l_registry);
  markmt(g);
  markbeingfnz(g);  /* mark any finalizing object left from previous cycle */
}